

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

uint GetErrorLocationLineNumber(char *codeStart,char *errorPos)

{
  uint uVar1;
  
  uVar1 = 0;
  if (errorPos != (char *)0x0 && codeStart != (char *)0x0) {
    uVar1 = 1;
    for (; codeStart < errorPos; codeStart = codeStart + 1) {
      uVar1 = uVar1 + (*codeStart == '\n');
    }
  }
  return uVar1;
}

Assistant:

unsigned GetErrorLocationLineNumber(const char *codeStart, const char *errorPos)
{
	if(!codeStart)
		return 0;

	if(!errorPos)
		return 0;

	int line = 1;
	for(const char *pos = codeStart; pos < errorPos; pos++)
		line += *pos == '\n';

	return line;
}